

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O0

void ssh1_bpp_free(BinaryPacketProtocol *bpp)

{
  long lVar1;
  ssh1_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  if (bpp[-1].ic_in_raw.fn != (toplevel_callback_fn_t)0x0) {
    ssh_cipher_free((ssh_cipher *)bpp[-1].ic_in_raw.fn);
  }
  if (bpp[-1].ic_in_raw.ctx != (void *)0x0) {
    ssh_cipher_free((ssh_cipher *)bpp[-1].ic_in_raw.ctx);
  }
  if (*(long *)&bpp[-1].ic_out_pq.queued != 0) {
    ssh_compressor_free(*(ssh_compressor **)&bpp[-1].ic_out_pq.queued);
  }
  lVar1._0_4_ = bpp[-1].remote_bugs;
  lVar1._4_1_ = bpp[-1].ext_info_rsa_sha256_ok;
  lVar1._5_1_ = bpp[-1].ext_info_rsa_sha512_ok;
  lVar1._6_1_ = bpp[-1].expect_close;
  lVar1._7_1_ = bpp[-1].field_0xdf;
  if (lVar1 != 0) {
    ssh_decompressor_free(*(ssh_decompressor **)&bpp[-1].remote_bugs);
  }
  if (*(long *)&bpp[-1].ic_in_raw.queued != 0) {
    crcda_free_context(*(crcda_ctx **)&bpp[-1].ic_in_raw.queued);
  }
  safefree(bpp[-1].ssh);
  safefree(&bpp[-1].out_pq);
  return;
}

Assistant:

static void ssh1_bpp_free(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);
    if (s->cipher_in)
        ssh_cipher_free(s->cipher_in);
    if (s->cipher_out)
        ssh_cipher_free(s->cipher_out);
    if (s->compctx)
        ssh_compressor_free(s->compctx);
    if (s->decompctx)
        ssh_decompressor_free(s->decompctx);
    if (s->crcda_ctx)
        crcda_free_context(s->crcda_ctx);
    sfree(s->pktin);
    sfree(s);
}